

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.c
# Opt level: O3

int faup_snapshot_item_append(faup_snapshot_t *snapshot,char *item_name)

{
  size_t sVar1;
  faup_snapshot_item_t *pfVar2;
  faup_snapshot_item_t **ppfVar3;
  int iVar4;
  size_t __nmemb;
  
  pfVar2 = faup_snapshot_item_get(snapshot,item_name);
  iVar4 = 0;
  if (pfVar2 == (faup_snapshot_item_t *)0x0) {
    ppfVar3 = (faup_snapshot_item_t **)realloc(snapshot->items,snapshot->length * 8 + 8);
    snapshot->items = ppfVar3;
    if (ppfVar3 == (faup_snapshot_item_t **)0x0) {
      faup_snapshot_item_append_cold_1();
      iVar4 = -1;
    }
    else {
      pfVar2 = faup_snapshot_item_new(item_name);
      sVar1 = snapshot->length;
      snapshot->items[sVar1] = pfVar2;
      __nmemb = sVar1 + 1;
      snapshot->length = __nmemb;
      qsort(snapshot->items,__nmemb,8,compare_simple);
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int faup_snapshot_item_append(faup_snapshot_t *snapshot, char *item_name)
{
  faup_snapshot_item_t *item;
  void *arg;
  
  item = faup_snapshot_item_get(snapshot, item_name);
  if (!item) {
    snapshot->items = realloc(snapshot->items, sizeof(faup_snapshot_item_t *) * (snapshot->length + 1));
    if (!snapshot->items) {
      fprintf(stderr, "Cannot allocatate a snapshot_item!\n");
      return -1;
    }
    snapshot->items[snapshot->length] = faup_snapshot_item_new(item_name);
    snapshot->length++;

    qsort(snapshot->items, snapshot->length, sizeof(faup_snapshot_item_t *), compare_simple);

  }
  
  return 0;
}